

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

void __thiscall
wasm::
AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
::checkMonotonicity(AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
                    *this,BasicBlock *bb,Element *first,Element *second,Element *firstResult,
                   Element *secondResult)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  Fatal local_360;
  stringstream local_1c8 [8];
  stringstream ss;
  undefined1 local_1b8 [384];
  LatticeComparison afterCmp;
  LatticeComparison beforeCmp;
  Element *secondResult_local;
  Element *firstResult_local;
  Element *second_local;
  Element *first_local;
  BasicBlock *bb_local;
  AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
  *this_local;
  
  _afterCmp = secondResult;
  secondResult_local = firstResult;
  firstResult_local = second;
  second_local = first;
  first_local = (Element *)bb;
  bb_local = (BasicBlock *)this;
  local_1b8._380_4_ =
       analysis::FinitePowersetLattice<wasm::LocalSet_*>::compare(this->lattice,first,second);
  local_1b8._376_4_ =
       analysis::FinitePowersetLattice<wasm::LocalSet_*>::compare
                 (this->lattice,secondResult_local,_afterCmp);
  if ((((local_1b8._380_4_ != NO_RELATION) &&
       ((local_1b8._380_4_ != LESS || ((local_1b8._376_4_ != LESS && (local_1b8._376_4_ != EQUAL))))
       )) && ((local_1b8._380_4_ != GREATER ||
              ((local_1b8._376_4_ != GREATER && (local_1b8._376_4_ != EQUAL)))))) &&
     ((local_1b8._380_4_ != EQUAL || (local_1b8._376_4_ != EQUAL)))) {
    std::__cxx11::stringstream::stringstream(local_1c8);
    printFailureInfo(this,(ostream *)local_1b8);
    std::operator<<((ostream *)local_1b8,"Elements ");
    analysis::FiniteIntPowersetLattice::Element::print(second_local,(ostream *)local_1b8);
    std::operator<<((ostream *)local_1b8," -> ");
    analysis::FiniteIntPowersetLattice::Element::print(secondResult_local,(ostream *)local_1b8);
    std::operator<<((ostream *)local_1b8," and ");
    analysis::FiniteIntPowersetLattice::Element::print(firstResult_local,(ostream *)local_1b8);
    std::operator<<((ostream *)local_1b8," -> ");
    analysis::FiniteIntPowersetLattice::Element::print(_afterCmp,(ostream *)local_1b8);
    std::operator<<((ostream *)local_1b8,
                    "\n show that the transfer function is not monotone when given the input:\n");
    wasm::analysis::BasicBlock::print((ostream *)first_local,(Module *)local_1b8,0);
    std::operator<<((ostream *)local_1b8,"\n");
    Fatal::Fatal(&local_360);
    std::__cxx11::stringstream::str();
    Fatal::operator<<(&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    Fatal::~Fatal(&local_360);
  }
  return;
}

Assistant:

void checkMonotonicity(const BasicBlock& bb,
                         typename L::Element& first,
                         typename L::Element& second,
                         typename L::Element& firstResult,
                         typename L::Element& secondResult) {
    LatticeComparison beforeCmp = lattice.compare(first, second);
    LatticeComparison afterCmp = lattice.compare(firstResult, secondResult);

    // Cases in which monotonicity is preserved.
    if (beforeCmp == LatticeComparison::NO_RELATION) {
      // If there is no relation in the first place, we can't expect anything.
      return;
    } else if (beforeCmp == LatticeComparison::LESS &&
               (afterCmp == LatticeComparison::LESS ||
                afterCmp == LatticeComparison::EQUAL)) {
      // x < y and f(x) <= f(y)
      return;
    } else if (beforeCmp == LatticeComparison::GREATER &&
               (afterCmp == LatticeComparison::GREATER ||
                afterCmp == LatticeComparison::EQUAL)) {
      // x > y and f(x) >= f(y)
      return;
    } else if (beforeCmp == LatticeComparison::EQUAL &&
               afterCmp == LatticeComparison::EQUAL) {
      // x = y and f(x) = f(y)
      return;
    }

    std::stringstream ss;
    printFailureInfo(ss);

    ss << "Elements ";
    first.print(ss);
    ss << " -> ";
    firstResult.print(ss);
    ss << " and ";
    second.print(ss);
    ss << " -> ";
    secondResult.print(ss);
    ss << "\n show that the transfer function is not monotone when given the "
          "input:\n";
    bb.print(ss);
    ss << "\n";

    Fatal() << ss.str();
  }